

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool *p_selected,bool enabled)

{
  bool bVar1;
  byte *in_RDX;
  bool in_stack_000000c6;
  bool in_stack_000000c7;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  bool local_1;
  
  bVar1 = MenuItemEx(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,
                     in_stack_000000c6);
  if (bVar1) {
    if (in_RDX != (byte *)0x0) {
      *in_RDX = (*in_RDX ^ 0xff) & 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool* p_selected, bool enabled)
{
    if (MenuItemEx(label, NULL, shortcut, p_selected ? *p_selected : false, enabled))
    {
        if (p_selected)
            *p_selected = !*p_selected;
        return true;
    }
    return false;
}